

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void do_fmlal(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  uint32_t uVar1;
  uint32_t is_2_00;
  float32 fVar2;
  float32 xb;
  uintptr_t opr_sz;
  uint64_t uVar3;
  uintptr_t max_sz;
  float32 m_1;
  float32 n_1;
  uint64_t m_4;
  uint64_t n_4;
  int is_q;
  int is_2;
  int is_s;
  intptr_t oprsz;
  intptr_t i;
  _Bool fz16_local;
  uint32_t desc_local;
  float_status *fpst_local;
  void *vm_local;
  void *vn_local;
  float32 *d_local;
  
  opr_sz = simd_oprsz(desc);
  uVar1 = extract32(desc,10,1);
  is_2_00 = extract32(desc,0xb,1);
  m_4 = load4_f16((uint64_t *)vn,(uint)(opr_sz == 0x10),is_2_00);
  uVar3 = load4_f16((uint64_t *)vm,(uint)(opr_sz == 0x10),is_2_00);
  if (uVar1 != 0) {
    m_4 = m_4 ^ 0x8000800080008000;
  }
  for (oprsz = 0; oprsz < (long)opr_sz / 4; oprsz = oprsz + 1) {
    fVar2 = float16_to_float32_by_bits((uint32_t)(m_4 >> ((byte)(oprsz << 4) & 0x3f)),fz16);
    xb = float16_to_float32_by_bits((uint32_t)(uVar3 >> ((byte)(oprsz << 4) & 0x3f)),fz16);
    fVar2 = float32_muladd_aarch64(fVar2,xb,d[oprsz],0,fpst);
    d[oprsz] = fVar2;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(d,opr_sz,max_sz);
  return;
}

Assistant:

static void do_fmlal(float32 *d, void *vn, void *vm, float_status *fpst,
                     uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int is_q = oprsz == 16;
    uint64_t n_4, m_4;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);
    m_4 = load4_f16(vm, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        float32 m_1 = float16_to_float32_by_bits(m_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}